

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::
modify_if<int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_ModifyIf_Test::TestBody()::__0&>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
           *this,key_arg<int> *key,anon_class_1_0_00000001 *f)

{
  bool bVar1;
  anon_class_1_0_00000001 *f_local;
  key_arg<int> *key_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_local;
  
  bVar1 = modify_if_impl<int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_ModifyIf_Test::TestBody()::__0&,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                    (this,key,f);
  return bVar1;
}

Assistant:

bool modify_if(const key_arg<K>& key, F&& f) {
        return modify_if_impl<K, F, UniqueLock>(key, std::forward<F>(f));
    }